

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_fparith(ASMState *as,IRIns *ir,x86Op xo)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Reg rr;
  int iVar5;
  uint rb;
  x86Op in_EDX;
  IRIns *in_RSI;
  ASMState *in_RDI;
  IRRef tmp;
  Reg right;
  Reg dest;
  RegSet allow;
  IRRef rref;
  IRRef lref;
  IRIns *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint allow_00;
  
  uVar2 = (uint)(in_RSI->field_0).op1;
  uVar3 = (uint)(in_RSI->field_0).op2;
  allow_00 = 0xffff0000;
  bVar1 = *(byte *)((long)in_RDI->ir + (ulong)uVar3 * 8 + 6);
  uVar4 = (uint)bVar1;
  if ((bVar1 & 0x80) == 0) {
    allow_00 = (1 << (bVar1 & 0x1f) ^ 0xffffffffU) & 0xffff0000;
    in_RDI->weakset = (1 << (bVar1 & 0x1f) ^ 0xffffffffU) & in_RDI->weakset;
  }
  rr = ra_dest((ASMState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8,0);
  rb = rr;
  if ((uVar2 != uVar3) && (rb = uVar4, (uVar4 & 0x80) != 0)) {
    iVar5 = asm_swapops(in_RDI,in_RSI);
    uVar4 = uVar3;
    if (iVar5 != 0) {
      uVar4 = uVar2;
      uVar2 = uVar3;
    }
    allow_00 = (1 << ((byte)rr & 0x1f) ^ 0xffffffffU) & allow_00;
    rb = asm_fuseload((ASMState *)CONCAT44(in_EDX,uVar2),uVar4,allow_00);
    uVar3 = uVar4;
  }
  emit_mrm(in_RDI,in_EDX,rr,rb);
  ra_left((ASMState *)CONCAT44(uVar3,allow_00),rr,rb);
  return;
}

Assistant:

static void asm_fparith(ASMState *as, IRIns *ir, x86Op xo)
{
  IRRef lref = ir->op1;
  IRRef rref = ir->op2;
  RegSet allow = RSET_FPR;
  Reg dest;
  Reg right = IR(rref)->r;
  if (ra_hasreg(right)) {
    rset_clear(allow, right);
    ra_noweak(as, right);
  }
  dest = ra_dest(as, ir, allow);
  if (lref == rref) {
    right = dest;
  } else if (ra_noreg(right)) {
    if (asm_swapops(as, ir)) {
      IRRef tmp = lref; lref = rref; rref = tmp;
    }
    right = asm_fuseload(as, rref, rset_clear(allow, dest));
  }
  emit_mrm(as, xo, dest, right);
  ra_left(as, dest, lref);
}